

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v6::internal::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  char cVar1;
  bool bVar2;
  int value_00;
  type tVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  buffer<char> *in_RDX;
  ulong in_RSI;
  uint in_EDI;
  unkbyte10 in_stack_00000008;
  char *fraction_end;
  int fraction_size;
  char *p;
  int exp;
  char sign;
  char *exp_pos;
  char *end;
  int fraction_size_1;
  char *p_1;
  char *end_1;
  anon_class_1_0_00000001 is_digit;
  type size;
  int result;
  _func_int_char_ptr_size_t_char_ptr_varargs *snprintf_ptr;
  size_t capacity;
  char *begin;
  size_t offset;
  char *format_ptr;
  char format [7];
  undefined2 uVar7;
  undefined6 in_stack_fffffffffffffef2;
  int local_d0;
  char local_c8;
  char local_c7;
  char local_c5;
  uint local_c4;
  char *local_c0;
  int local_b4;
  char *local_b0;
  int local_a8;
  char *local_a0;
  char *local_88;
  anon_class_1_0_00000001 local_71;
  type local_70;
  int local_6c;
  code *local_68;
  size_t local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  char local_3f [7];
  buffer<char> *local_38;
  uint local_2c;
  unkbyte10 local_28;
  undefined8 local_c;
  int local_4;
  
  local_28 = in_stack_00000008;
  cVar1 = (char)(in_RSI >> 0x20);
  if ((cVar1 == '\0') || (local_2c = in_EDI, cVar1 == '\x01')) {
    local_c4 = in_EDI;
    if ((int)in_EDI < 0) {
      local_c4 = 6;
    }
    local_2c = local_c4 - 1;
  }
  local_48 = local_3f + 1;
  local_3f[0] = '%';
  if ((((uint)(in_RSI >> 0x35) & 1) != 0) && (cVar1 == '\x03')) {
    local_48 = local_3f + 2;
    local_3f[1] = 0x23;
  }
  if (-1 < (int)local_2c) {
    pcVar6 = local_48 + 1;
    *local_48 = '.';
    local_48 = local_48 + 2;
    *pcVar6 = '*';
  }
  pcVar6 = local_48 + 1;
  *local_48 = 'L';
  if (cVar1 == '\x03') {
    local_c8 = 'A';
    if ((in_RSI & 0x1000000000000) == 0) {
      local_c8 = 'a';
    }
    local_c7 = local_c8;
  }
  else {
    local_c5 = 'f';
    if (cVar1 != '\x02') {
      local_c5 = 'e';
    }
    local_c7 = local_c5;
  }
  local_48 = local_48 + 2;
  *pcVar6 = local_c7;
  *local_48 = '\0';
  local_38 = in_RDX;
  local_c = in_RSI;
  local_50 = buffer<char>::size(in_RDX);
  while( true ) {
    while( true ) {
      local_58 = buffer<char>::data(local_38);
      local_58 = local_58 + local_50;
      sVar4 = buffer<char>::capacity(local_38);
      local_60 = sVar4 - local_50;
      local_68 = snprintf;
      uVar7 = (undefined2)((unkuint10)local_28 >> 0x40);
      sVar4 = (size_t)local_28;
      if ((int)local_2c < 0) {
        local_d0 = snprintf(local_58,local_60,local_3f,snprintf);
      }
      else {
        local_d0 = snprintf(local_58,local_60,local_3f,(ulong)local_2c,snprintf);
      }
      local_6c = local_d0;
      if (-1 < local_d0) break;
      buffer<char>::capacity(local_38);
      buffer<char>::reserve((buffer<char> *)CONCAT62(in_stack_fffffffffffffef2,uVar7),sVar4);
    }
    local_70 = to_unsigned<int>(local_d0);
    if (local_70 < local_60) break;
    buffer<char>::reserve((buffer<char> *)CONCAT62(in_stack_fffffffffffffef2,uVar7),sVar4);
  }
  cVar1 = (char)(local_c >> 0x20);
  if (cVar1 == '\x02') {
    if (local_2c == 0) {
      buffer<char>::resize((buffer<char> *)CONCAT62(in_stack_fffffffffffffef2,uVar7),sVar4);
      local_4 = 0;
    }
    else {
      pcVar5 = local_58 + local_70;
      pcVar6 = pcVar5;
      do {
        local_88 = pcVar6;
        pcVar6 = local_88 + -1;
        bVar2 = snprintf_float<long_double>::anon_class_1_0_00000001::operator()(&local_71,*pcVar6);
      } while (bVar2);
      value_00 = ((int)pcVar5 - (int)pcVar6) + -1;
      tVar3 = to_unsigned<int>(value_00);
      memmove(pcVar6,local_88,(ulong)tVar3);
      buffer<char>::resize((buffer<char> *)CONCAT62(in_stack_fffffffffffffef2,uVar7),sVar4);
      local_4 = -value_00;
    }
  }
  else if (cVar1 == '\x03') {
    buffer<char>::resize((buffer<char> *)CONCAT62(in_stack_fffffffffffffef2,uVar7),sVar4);
    local_4 = 0;
  }
  else {
    pcVar6 = local_58 + local_70;
    do {
      local_a0 = pcVar6;
      pcVar6 = local_a0 + -1;
    } while (*pcVar6 != 'e');
    local_a8 = 0;
    local_b0 = local_a0 + 1;
    do {
      pcVar5 = local_b0 + 1;
      local_a8 = local_a8 * 10 + *local_b0 + -0x30;
      local_b0 = pcVar5;
    } while (pcVar5 != local_58 + local_70);
    if (*local_a0 == '-') {
      local_a8 = -local_a8;
    }
    local_b4 = 0;
    if (pcVar6 != local_58 + 1) {
      for (local_c0 = local_a0 + -2; *local_c0 == '0'; local_c0 = local_c0 + -1) {
      }
      local_b4 = ((int)local_c0 - (int)local_58) + -1;
      pcVar6 = local_58 + 1;
      pcVar5 = local_58 + 2;
      tVar3 = to_unsigned<int>(local_b4);
      memmove(pcVar6,pcVar5,(ulong)tVar3);
    }
    to_unsigned<int>(local_b4);
    buffer<char>::resize((buffer<char> *)CONCAT62(in_stack_fffffffffffffef2,uVar7),sVar4);
    local_4 = local_a8 - local_b4;
  }
  return local_4;
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // Ths longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto becase of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      buf.reserve(buf.capacity() + 1);  // The buffer will grow exponentially.
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}